

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

string * __thiscall
pbrt::SubsurfaceMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SubsurfaceMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             "[ SubsurfaceMaterial displacment: %s scale: %f sigma_a: %s sigma_s: %s reflectance: %s mfp: %s uRoughness: %s vRoughness: %s eta: %f remapRoughness: %s ]"
             ,&this->displacement,&this->scale,&this->sigma_a,&this->sigma_s,&this->reflectance,
             &this->mfp,&this->uRoughness,&this->vRoughness,&this->eta,&this->remapRoughness);
  return __return_storage_ptr__;
}

Assistant:

std::string SubsurfaceMaterial::ToString() const {
    return StringPrintf("[ SubsurfaceMaterial displacment: %s scale: %f "
                        "sigma_a: %s sigma_s: %s "
                        "reflectance: %s mfp: %s uRoughness: %s vRoughness: %s "
                        "eta: %f remapRoughness: %s ]",
                        displacement, scale, sigma_a, sigma_s, reflectance, mfp,
                        uRoughness, vRoughness, eta, remapRoughness);
}